

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,false,false,true,false>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  unsigned_long uVar13;
  ulong uVar14;
  idx_t iVar15;
  ulong uVar16;
  sel_t sVar17;
  long lVar18;
  
  if (count + 0x3f < 0x40) {
    iVar15 = 0;
  }
  else {
    puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar15 = 0;
    uVar9 = 0;
    uVar14 = 0;
    do {
      if (puVar3 == (unsigned_long *)0x0) {
        uVar13 = 0xffffffffffffffff;
      }
      else {
        uVar13 = puVar3[uVar9];
      }
      uVar10 = uVar14 + 0x40;
      if (count <= uVar14 + 0x40) {
        uVar10 = count;
      }
      uVar16 = uVar10;
      if (uVar13 != 0) {
        uVar16 = uVar14;
        if (uVar13 == 0xffffffffffffffff) {
          if (uVar14 < uVar10) {
            psVar4 = sel->sel_vector;
            psVar5 = true_sel->sel_vector;
            uVar14 = uVar14 << 4 | 8;
            do {
              uVar12 = uVar16;
              if (psVar4 != (sel_t *)0x0) {
                uVar12 = (ulong)psVar4[uVar16];
              }
              iVar1 = *(int *)((long)ldata + (uVar14 - 8));
              iVar2 = *(int *)((long)rdata + (uVar14 - 8));
              if (((iVar1 != iVar2) ||
                  (*(int *)((long)ldata + (uVar14 - 4)) != *(int *)((long)rdata + (uVar14 - 4)))) ||
                 (uVar8 = 1,
                 *(long *)((long)&ldata->months + uVar14) !=
                 *(long *)((long)&rdata->months + uVar14))) {
                lVar6 = *(long *)((long)&ldata->months + uVar14);
                lVar18 = (long)*(int *)((long)ldata + (uVar14 - 4)) + lVar6 / 86400000000;
                lVar7 = *(long *)((long)&rdata->months + uVar14);
                lVar11 = (long)*(int *)((long)rdata + (uVar14 - 4)) + lVar7 / 86400000000;
                if ((long)iVar1 + lVar18 / 0x1e == (long)iVar2 + lVar11 / 0x1e) {
                  uVar8 = 0;
                  if (lVar18 % 0x1e == lVar11 % 0x1e) {
                    uVar8 = (ulong)(lVar6 % 86400000000 == lVar7 % 86400000000);
                  }
                }
                else {
                  uVar8 = 0;
                }
              }
              psVar5[iVar15] = (sel_t)uVar12;
              iVar15 = iVar15 + uVar8;
              uVar16 = uVar16 + 1;
              uVar14 = uVar14 + 0x10;
            } while (uVar10 != uVar16);
          }
        }
        else if (uVar14 < uVar10) {
          psVar4 = sel->sel_vector;
          psVar5 = true_sel->sel_vector;
          uVar12 = uVar14 << 4 | 8;
          uVar16 = 0;
          do {
            if (psVar4 == (sel_t *)0x0) {
              sVar17 = (int)uVar14 + (int)uVar16;
            }
            else {
              sVar17 = psVar4[uVar14 + uVar16];
            }
            if ((uVar13 >> (uVar16 & 0x3f) & 1) == 0) {
              uVar8 = 0;
            }
            else {
              iVar1 = *(int *)((long)ldata + (uVar12 - 8));
              iVar2 = *(int *)((long)rdata + (uVar12 - 8));
              if (((iVar1 != iVar2) ||
                  (*(int *)((long)ldata + (uVar12 - 4)) != *(int *)((long)rdata + (uVar12 - 4)))) ||
                 (uVar8 = 1,
                 *(long *)((long)&ldata->months + uVar12) !=
                 *(long *)((long)&rdata->months + uVar12))) {
                lVar6 = *(long *)((long)&ldata->months + uVar12);
                lVar11 = (long)*(int *)((long)ldata + (uVar12 - 4)) + lVar6 / 86400000000;
                lVar7 = *(long *)((long)&rdata->months + uVar12);
                lVar18 = (long)*(int *)((long)rdata + (uVar12 - 4)) + lVar7 / 86400000000;
                if ((long)iVar1 + lVar11 / 0x1e == (long)iVar2 + lVar18 / 0x1e) {
                  uVar8 = 0;
                  if (lVar11 % 0x1e == lVar18 % 0x1e) {
                    uVar8 = (ulong)(lVar6 % 86400000000 == lVar7 % 86400000000);
                  }
                }
                else {
                  uVar8 = 0;
                }
              }
            }
            psVar5[iVar15] = sVar17;
            iVar15 = uVar8 + iVar15;
            uVar16 = uVar16 + 1;
            uVar12 = uVar12 + 0x10;
          } while ((uVar14 - uVar10) + uVar16 != 0);
          uVar16 = uVar14 + uVar16;
        }
      }
      uVar9 = uVar9 + 1;
      uVar14 = uVar16;
    } while (uVar9 != count + 0x3f >> 6);
  }
  return iVar15;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}